

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Pair *__dest;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Pair *pPVar10;
  int iVar11;
  
  pIVar4 = GImGui;
  uVar2 = (this->Data).Size;
  lVar7 = (long)(int)uVar2;
  __dest = (this->Data).Data;
  pPVar10 = __dest;
  uVar5 = uVar2;
  if (0 < lVar7) {
    do {
      uVar3 = uVar5 >> 1;
      uVar6 = uVar3;
      if (pPVar10[uVar3].key < key) {
        uVar6 = uVar5 + ~uVar3;
        pPVar10 = pPVar10 + (ulong)uVar3 + 1;
      }
      uVar5 = uVar6;
    } while (0 < (int)uVar6);
  }
  if ((pPVar10 != __dest + lVar7) && (pPVar10->key == key)) goto LAB_0011fb7c;
  if ((pPVar10 < __dest) || (__dest + lVar7 < pPVar10)) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x37b,
                  "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                 );
  }
  lVar9 = (long)pPVar10 - (long)__dest;
  if (uVar2 == (this->Data).Capacity) {
    iVar11 = 4;
    if (uVar2 != 0) {
      iVar11 = uVar2 * 2;
    }
    if ((int)uVar2 < iVar11) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (Pair *)(*(pIVar4->IO).MemAllocFn)((long)iVar11 << 4);
      pPVar10 = (this->Data).Data;
      if (pPVar10 == (Pair *)0x0) {
LAB_0011fb2f:
        pPVar10 = (Pair *)0x0;
        pIVar4 = GImGui;
      }
      else {
        memcpy(__dest,pPVar10,(long)(this->Data).Size << 4);
        pIVar4 = GImGui;
        pPVar10 = (this->Data).Data;
        if (pPVar10 == (Pair *)0x0) goto LAB_0011fb2f;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(pIVar4->IO).MemFreeFn)(pPVar10);
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar11;
      lVar7 = (long)(this->Data).Size;
    }
  }
  lVar8 = lVar7 - (lVar9 >> 4);
  if (lVar8 != 0 && lVar9 >> 4 <= lVar7) {
    memmove((void *)((long)__dest + lVar9 + 0x10),(void *)((long)__dest + lVar9),lVar8 * 0x10);
    __dest = (this->Data).Data;
  }
  *(ImGuiID *)((long)__dest + lVar9) = key;
  *(void **)((long)__dest + lVar9 + 8) = default_val;
  (this->Data).Size = (this->Data).Size + 1;
  pPVar10 = (Pair *)(lVar9 + (long)(this->Data).Data);
LAB_0011fb7c:
  return (void **)&pPVar10->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}